

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::announce_piece(peer_connection *this,piece_index_t index)

{
  session_settings *psVar1;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var2;
  _WordT _Var3;
  bool bVar4;
  int iVar5;
  piece_index_t pVar6;
  uint uVar7;
  unique_lock<std::mutex> local_38;
  
  iVar5 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
  if ((char)iVar5 == '\0') {
    psVar1 = (this->super_peer_connection_hot_members).m_settings;
    local_38._M_device = &psVar1->m_mutex;
    local_38._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    _Var3 = (psVar1->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
    if ((((_Var3 & 4) == 0) &&
        (_Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
              (this->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
              super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t,
        (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
        _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0)) &&
       (*(int *)_Var2._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != 0)) {
      pVar6.m_val = index.m_val + 0x1f;
      if (-1 < index.m_val) {
        pVar6.m_val = index.m_val;
      }
      uVar7 = 0x80000000 >> ((byte)index.m_val & 0x1f);
      if ((*(uint *)((long)_Var2._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                    ((long)(pVar6.m_val >> 5) + 1) * 4) &
          (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)) != 0) {
        peer_log(this,outgoing_message,"HAVE","piece: %d SUPPRESSED",index.m_val);
        return;
      }
    }
    bVar4 = disconnect_if_redundant(this);
    if (!bVar4) {
      peer_log(this,outgoing_message,"HAVE","piece: %d",index.m_val);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x25])(this,index.m_val);
    }
  }
  return;
}

Assistant:

void peer_connection::announce_piece(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		// dont announce during handshake
		if (in_handshake()) return;

		// optimization, don't send have messages
		// to peers that already have the piece
		if (!m_settings.get_bool(settings_pack::send_redundant_have)
			&& has_piece(index))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::outgoing_message, "HAVE", "piece: %d SUPPRESSED"
				, static_cast<int>(index));
#endif
			return;
		}

		if (disconnect_if_redundant()) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "HAVE", "piece: %d"
			, static_cast<int>(index));
#endif
		write_have(index);
#if TORRENT_USE_ASSERTS
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
#endif
	}